

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O2

unique_ptr<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>_>
* __thiscall
libguarded::detail::
allocate_unique<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node,std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>,CsSignal::SignalBase::ConnectStruct>
          (unique_ptr<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>_>
           *__return_storage_ptr__,detail *this,
          allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>
          *alloc,ConnectStruct *args)

{
  pointer this_00;
  
  this_00 = std::
            allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
            ::allocate((allocator_type *)this,1);
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  ::node::node<CsSignal::SignalBase::ConnectStruct>(this_00,(ConnectStruct *)alloc);
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>_>
  .
  super__Head_base<0UL,_libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node_*,_false>
  ._M_head_impl = this_00;
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<T, deallocator<Alloc>> allocate_unique(Alloc &alloc, Args &&... args)
{
   using allocator_traits = std::allocator_traits<Alloc>;

   auto p = allocator_traits::allocate(alloc, 1);

   try {
      allocator_traits::construct(alloc, p, std::forward<Args>(args)...);
      return {p, deallocator<Alloc>{alloc}};

   } catch (...) {
      allocator_traits::deallocate(alloc, p, 1);
      throw;
   }
}